

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

void __thiscall
QGraphicsItemAnimationPrivate::~QGraphicsItemAnimationPrivate(QGraphicsItemAnimationPrivate *this)

{
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer
            (&(this->yTranslation).d);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer
            (&(this->xTranslation).d);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer
            (&(this->horizontalShear).d);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer
            (&(this->verticalShear).d);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer
            (&(this->horizontalScale).d);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer
            (&(this->verticalScale).d);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer(&(this->rotation).d);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer(&(this->yPosition).d);
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::~QArrayDataPointer(&(this->xPosition).d);
  QWeakPointer<QObject>::~QWeakPointer(&(this->timeLine).wp);
  return;
}

Assistant:

inline QGraphicsItemAnimationPrivate()
        : q(nullptr), timeLine(nullptr), item(nullptr), step(0)
    { }